

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddRecursiveImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int from_here)

{
  size_type sVar1;
  string *element_name;
  int local_58;
  int i;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string error_message;
  int from_here_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  error_message.field_2._12_4_ = from_here;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"File recursively imports itself: ",&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_58 = error_message.field_2._12_4_;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->tables_->pending_files_);
    if (sVar1 <= (ulong)(long)local_58) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->tables_->pending_files_,(long)local_58);
    std::__cxx11::string::append((string *)local_40);
    std::__cxx11::string::append(local_40);
    local_58 = local_58 + 1;
  }
  FileDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)local_40);
  element_name = FileDescriptorProto::name_abi_cxx11_(proto);
  AddError(this,element_name,&proto->super_Message,OTHER,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void DescriptorBuilder::AddRecursiveImportError(
    const FileDescriptorProto& proto, int from_here) {
  string error_message("File recursively imports itself: ");
  for (int i = from_here; i < tables_->pending_files_.size(); i++) {
    error_message.append(tables_->pending_files_[i]);
    error_message.append(" -> ");
  }
  error_message.append(proto.name());

  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
           error_message);
}